

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdComputeSchnorrSigPoint(void *handle,char *msg,char *nonce,char *pubkey,char **sigpoint)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  allocator local_f3;
  allocator local_f2;
  allocator local_f1;
  undefined1 local_f0 [32];
  string local_d0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  Pubkey sig_point;
  string local_50;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(msg);
  if (bVar1) {
    local_f0._0_8_ = "cfdcapi_key.cpp";
    local_f0._8_4_ = 0x308;
    local_f0._16_8_ = "CfdComputeSchnorrSigPoint";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_f0,"msg is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_f0,"Failed to parameter. msg is null or empty.",
               (allocator *)&local_d0);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_f0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(nonce);
  if (bVar1) {
    local_f0._0_8_ = "cfdcapi_key.cpp";
    local_f0._8_4_ = 0x30e;
    local_f0._16_8_ = "CfdComputeSchnorrSigPoint";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_f0,"nonce is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_f0,"Failed to parameter. nonce is null or empty.",
               (allocator *)&local_d0);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_f0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(pubkey);
  if (bVar1) {
    local_f0._0_8_ = "cfdcapi_key.cpp";
    local_f0._8_4_ = 0x314;
    local_f0._16_8_ = "CfdComputeSchnorrSigPoint";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_f0,"pubkey is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_f0,"Failed to parameter. pubkey is null or empty.",
               (allocator *)&local_d0);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_f0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (sigpoint != (char **)0x0) {
    std::__cxx11::string::string((string *)local_f0,msg,&local_f1);
    cfd::core::ByteData256::ByteData256((ByteData256 *)&local_80,(string *)local_f0);
    std::__cxx11::string::string((string *)&local_d0,nonce,&local_f2);
    cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&local_98,&local_d0);
    std::__cxx11::string::string((string *)&local_50,pubkey,&local_f3);
    cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&local_b0,&local_50);
    cfd::core::SchnorrUtil::ComputeSigPoint
              (&sig_point,(ByteData256 *)&local_80,(SchnorrPubkey *)&local_98,
               (SchnorrPubkey *)&local_b0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_98);
    std::__cxx11::string::~string((string *)&local_d0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_80);
    std::__cxx11::string::~string((string *)local_f0);
    cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_f0,&sig_point);
    pcVar2 = cfd::capi::CreateString((string *)local_f0);
    *sigpoint = pcVar2;
    std::__cxx11::string::~string((string *)local_f0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig_point);
    return 0;
  }
  local_f0._0_8_ = "cfdcapi_key.cpp";
  local_f0._8_4_ = 0x31a;
  local_f0._16_8_ = "CfdComputeSchnorrSigPoint";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_f0,"sigpoint is null.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_f0,"Failed to parameter. sigpoint is null.",(allocator *)&local_d0);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_f0);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdComputeSchnorrSigPoint(
    void* handle, const char* msg, const char* nonce, const char* pubkey,
    char** sigpoint) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(msg)) {
      warn(CFD_LOG_SOURCE, "msg is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. msg is null or empty.");
    }
    if (IsEmptyString(nonce)) {
      warn(CFD_LOG_SOURCE, "nonce is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. nonce is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (sigpoint == nullptr) {
      warn(CFD_LOG_SOURCE, "sigpoint is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sigpoint is null.");
    }

    Pubkey sig_point = SchnorrUtil::ComputeSigPoint(
        ByteData256(msg), SchnorrPubkey(nonce), SchnorrPubkey(pubkey));

    *sigpoint = CreateString(sig_point.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}